

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msat.hpp
# Opt level: O3

SAT * __thiscall CompoundFile::MSAT::buildSAT(SAT *__return_storage_ptr__,MSAT *this)

{
  istream *piVar1;
  MSAT *pMVar2;
  SAT *pSVar3;
  pointer pSVar4;
  int32_t secID;
  uint uVar5;
  long lVar6;
  int iVar7;
  int iVar8;
  char c;
  vector<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_> sat;
  SecID local_6c;
  vector<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_> local_68;
  MSAT *local_50;
  SAT *local_48;
  pointer local_40;
  pointer local_38;
  
  local_68.super__Vector_base<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.super__Vector_base<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_>._M_impl.
  super__Vector_impl_data._M_finish = (SecID *)0x0;
  local_68.super__Vector_base<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (SecID *)0x0;
  pSVar4 = (this->m_msat).
           super__Vector_base<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_40 = (this->m_msat).
             super__Vector_base<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_>._M_impl.
             super__Vector_impl_data._M_finish;
  local_48 = __return_storage_ptr__;
  if (pSVar4 != local_40) {
    local_50 = this;
    do {
      pMVar2 = local_50;
      local_38 = pSVar4;
      std::istream::seekg(local_50->m_stream,
                          (long)pSVar4->m_id * (long)local_50->m_header->m_sectorSize + 0x200,0);
      iVar8 = pMVar2->m_header->m_sectorSize;
      iVar7 = iVar8 + 3;
      if (-1 < iVar8) {
        iVar7 = iVar8;
      }
      if (3 < iVar8) {
        piVar1 = local_50->m_stream;
        iVar8 = 0;
        do {
          lVar6 = 0;
          uVar5 = 0;
          do {
            local_6c.m_id = local_6c.m_id & 0xffffff00;
            std::istream::get((char *)piVar1);
            uVar5 = uVar5 | (local_6c.m_id & 0xffU) << ((byte)lVar6 & 0x1f);
            lVar6 = lVar6 + 8;
          } while (lVar6 != 0x20);
          local_6c.m_id = uVar5;
          if (local_68.super__Vector_base<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_>
              ._M_impl.super__Vector_impl_data._M_finish ==
              local_68.super__Vector_base<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_>::
            _M_realloc_insert<CompoundFile::SecID>
                      (&local_68,
                       (iterator)
                       local_68.
                       super__Vector_base<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_>
                       ._M_impl.super__Vector_impl_data._M_finish,&local_6c);
          }
          else {
            (local_68.super__Vector_base<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_>.
             _M_impl.super__Vector_impl_data._M_finish)->m_id = uVar5;
            local_68.super__Vector_base<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_>.
            _M_impl.super__Vector_impl_data._M_finish =
                 local_68.
                 super__Vector_base<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_>.
                 _M_impl.super__Vector_impl_data._M_finish + 1;
          }
          iVar8 = iVar8 + 1;
        } while (iVar8 != iVar7 >> 2);
      }
      pSVar4 = local_38 + 1;
    } while (pSVar4 != local_40);
  }
  pSVar3 = local_48;
  std::vector<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_>::vector
            (&local_48->m_sat,&local_68);
  if (local_68.super__Vector_base<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_>._M_impl
      .super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_68.
                    super__Vector_base<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_68.
                          super__Vector_base<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_68.
                          super__Vector_base<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return pSVar3;
}

Assistant:

inline SAT
MSAT::buildSAT()
{
	std::vector< SecID > sat;

	for( std::vector< SecID >::const_iterator it = m_msat.begin(),
		last = m_msat.end(); it != last; ++it )
	{
		m_stream.seekg( calcFileOffset( *it, m_header.sectorSize() ) );

		loadSATSector( m_stream, sat, m_header.sectorSize() );
	}

	return SAT( sat );
}